

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void state_REP(Context *ctx)

{
  int iVar1;
  int iVar2;
  
  if (ctx->source_args[0].regtype != REG_TYPE_CONSTINT) {
    failf(ctx,"%s","REP argument isn\'t constint register");
  }
  iVar2 = ctx->reps;
  iVar1 = iVar2 + 1;
  ctx->reps = iVar1;
  if (ctx->max_reps <= iVar2) {
    ctx->max_reps = iVar1;
  }
  return;
}

Assistant:

static void state_REP(Context *ctx)
{
    const RegisterType regtype = ctx->source_args[0].regtype;
    if (regtype != REG_TYPE_CONSTINT)
        fail(ctx, "REP argument isn't constint register");

    ctx->reps++;
    if (ctx->reps > ctx->max_reps)
        ctx->max_reps = ctx->reps;
}